

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

pool_ptr<soul::heart::Variable> __thiscall
soul::heart::Parser::findVariable(Parser *this,FunctionParseState *state,string *name)

{
  long *plVar1;
  pointer pcVar2;
  pointer pBVar3;
  bool bVar4;
  long lVar5;
  undefined8 *in_RCX;
  long *plVar6;
  bool bVar7;
  string_view other;
  string_view other_00;
  string_view other_01;
  string_view other_02;
  string_view name_00;
  string_view other_03;
  string_view other_04;
  string variableName;
  TokenisedPathString path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  undefined1 local_e8 [184];
  
  lVar5 = std::__cxx11::string::find((char)in_RCX,0x3a);
  if (lVar5 == -1) {
    plVar6 = (long *)name[1]._M_dataplus._M_p;
    plVar1 = (long *)name[1]._M_string_length;
    bVar7 = plVar6 == plVar1;
    if (!bVar7) {
      other._M_str = (char *)*in_RCX;
      other._M_len = in_RCX[1];
      bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other);
      while (!bVar4) {
        plVar6 = plVar6 + 1;
        bVar7 = plVar6 == plVar1;
        if (bVar7) goto LAB_002549a3;
        other_00._M_str = (char *)*in_RCX;
        other_00._M_len = in_RCX[1];
        bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other_00);
      }
      (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser = (_func_int **)*plVar6;
      if (!bVar7) {
        return (pool_ptr<soul::heart::Variable>)(Variable *)this;
      }
    }
LAB_002549a3:
    pcVar2 = (name->_M_dataplus)._M_p;
    lVar5 = *(long *)(pcVar2 + 0x40);
    bVar7 = lVar5 == 0;
    if (!bVar7) {
      plVar6 = *(long **)(pcVar2 + 0x38);
      other_01._M_str = (char *)*in_RCX;
      other_01._M_len = in_RCX[1];
      bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other_01);
      if (!bVar4) {
        lVar5 = lVar5 * 8;
        do {
          lVar5 = lVar5 + -8;
          bVar7 = lVar5 == 0;
          if (bVar7) goto LAB_00254a11;
          plVar6 = plVar6 + 1;
          other_02._M_str = (char *)*in_RCX;
          other_02._M_len = in_RCX[1];
          bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other_02);
        } while (!bVar4);
      }
      (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser = (_func_int **)*plVar6;
      if (!bVar7) {
        return (pool_ptr<soul::heart::Variable>)(Variable *)this;
      }
    }
LAB_00254a11:
    pBVar3 = state[2].blocks.
             super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pBVar3 == (pointer)0x0) {
      throwInternalCompilerError("object != nullptr","operator->",0x3c);
    }
    name_00._M_len = pBVar3 + 0x25;
    name_00._M_str = (char *)in_RCX[1];
    Module::StateVariables::find((StateVariables *)this,name_00);
    if ((this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser == (_func_int **)0x0) {
      plVar6 = *(long **)((long)&name[1].field_2 + 8);
      if (plVar6 != (long *)0x0) {
        lVar5 = *plVar6;
        plVar6 = *(long **)(lVar5 + 0x20);
        plVar1 = *(long **)(lVar5 + 0x28);
        bVar7 = plVar6 == plVar1;
        if (!bVar7) {
          other_03._M_str = (char *)*in_RCX;
          other_03._M_len = in_RCX[1];
          bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other_03);
          while (!bVar4) {
            plVar6 = plVar6 + 1;
            bVar7 = plVar6 == plVar1;
            if (bVar7) goto LAB_00254ab5;
            other_04._M_str = (char *)*in_RCX;
            other_04._M_len = in_RCX[1];
            bVar4 = Identifier::operator==((Identifier *)(*plVar6 + 0x30),other_04);
          }
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser = (_func_int **)*plVar6;
          if (!bVar7) {
            return (pool_ptr<soul::heart::Variable>)(Variable *)this;
          }
        }
      }
LAB_00254ab5:
      Program::ProgramImpl::findVariableWithName
                ((ProgramImpl *)this,(string *)state[1].currentBlock);
    }
  }
  else {
    if (*(char *)*in_RCX != '$') {
      throwInternalCompilerError("name[0] == \'$\'","findVariable",0x461);
    }
    std::__cxx11::string::substr((ulong)&local_108,(ulong)in_RCX);
    TokenisedPathString::TokenisedPathString((TokenisedPathString *)local_e8,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    TokenisedPathString::getLastPart_abi_cxx11_(&local_128,(TokenisedPathString *)local_e8);
    TokenisedPathString::getParentPath_abi_cxx11_(&local_168,(TokenisedPathString *)local_e8);
    std::operator+(&local_188,"$",&local_128);
    TokenisedPathString::join(&local_148,&local_168,&local_188);
    Program::ProgramImpl::findVariableWithName((ProgramImpl *)this,(string *)state[1].currentBlock);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    local_e8._40_8_ = 0;
    if (8 < (ulong)local_e8._48_8_) {
      if ((Section *)local_e8._32_8_ != (Section *)0x0) {
        operator_delete__((void *)local_e8._32_8_);
      }
      local_e8._32_8_ = local_e8 + 0x38;
      local_e8._48_8_ = 8;
    }
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
  }
  return (pool_ptr<soul::heart::Variable>)(Variable *)this;
}

Assistant:

pool_ptr<heart::Variable> findVariable (const FunctionParseState& state, const std::string& name)
    {
        if (containsChar (name, ':'))
        {
            SOUL_ASSERT (name[0] == '$');
            TokenisedPathString path (name.substr (1));
            auto variableName = path.getLastPart();
            return program.findVariableWithName (TokenisedPathString::join (path.getParentPath(), "$" + variableName));
        }

        for (auto& v : state.variables)
            if (v->name == name)
                return v;

        for (auto& parameter : state.function.parameters)
            if (parameter->name == name)
                return parameter;

        if (auto stateVariable = module->stateVariables.find (name))
            return stateVariable;

        if (state.currentBlock != nullptr)
        {
            for (auto& blockParameter : state.currentBlock->block.parameters)
                if (blockParameter->name == name)
                    return blockParameter;
        }

        return program.findVariableWithName (name);
    }